

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::Read
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,TPZStream *buf,
          void *context)

{
  TPZSavable *pTVar1;
  TPZStepSolver<long_double> *pTVar2;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator=
            (&this->fAssemble,
             (TPZAutoPointer<TPZDohrAssembly<long_double>_> *)((long)context + 0x40));
  if (this != (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)context) {
    std::__cxx11::
    list<TPZAutoPointer<TPZDohrSubstruct<long_double>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>>>>
    ::_M_assign_dispatch<std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>>>>
              ((list<TPZAutoPointer<TPZDohrSubstruct<long_double>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>>>>
                *)&this->fGlobal,*(undefined8 *)((long)context + 0x20),(long)context + 0x20);
  }
  (*buf->_vptr_TPZStream[0x1f])(buf,&this->fNumCoarse,1);
  (*buf->_vptr_TPZStream[0x1d])(buf,&this->fNumThreads,1);
  pTVar1 = TPZPersistenceManager::GetInstance(buf);
  if (pTVar1 == (TPZSavable *)0x0) {
    pTVar2 = (TPZStepSolver<long_double> *)0x0;
  }
  else {
    pTVar2 = (TPZStepSolver<long_double> *)
             __dynamic_cast(pTVar1,&TPZSavable::typeinfo,&TPZStepSolver<long_double>::typeinfo,0);
  }
  this->fCoarse = pTVar2;
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::Read(TPZStream &buf, void *context )
{
    TPZMatrix<TVar>::Read(buf,context);
    TPZDohrMatrix<TVar,TSubStruct> *ptr = (TPZDohrMatrix<TVar,TSubStruct> *)(context);
    fAssemble = ptr->fAssembly;
    fGlobal = ptr->SubStructures();
    buf.Read(&fNumCoarse);
    buf.Read(&fNumThreads);
    fCoarse = dynamic_cast<TPZStepSolver<TVar> *>(TPZPersistenceManager::GetInstance(&buf));
}